

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O2

void addDisc(BamAlignment *aln,int *bpRegion,vector<DiscNode,_std::allocator<DiscNode>_> *nodes)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint local_b0;
  vector<int,_std::allocator<int>_> genomePositions;
  vector<int,_std::allocator<int>_> readPositions;
  vector<int,_std::allocator<int>_> clipSizes;
  DiscNode dn;
  
  bVar2 = BamTools::BamAlignment::IsMapped(aln);
  if (((bVar2) && (bVar2 = BamTools::BamAlignment::IsMateMapped(aln), bVar2)) &&
     (bVar2 = BamTools::BamAlignment::IsProperPair(aln), !bVar2)) {
    iVar10 = aln->Position;
    iVar6 = BamTools::BamAlignment::GetEndPosition(aln,false,false);
    bVar3 = BamTools::BamAlignment::IsReverseStrand(aln);
    iVar1 = aln->MatePosition;
    iVar8 = aln->Length + iVar1;
    bVar4 = BamTools::BamAlignment::IsMateReverseStrand(aln);
    iVar7 = aln->InsertSize;
    bVar2 = aln->Position <= aln->MatePosition;
    bVar5 = bVar4;
    iVar11 = iVar1;
    iVar9 = iVar8;
    if (!bVar2) {
      iVar7 = -iVar7;
      bVar5 = bVar3;
      bVar3 = bVar4;
      iVar11 = iVar10;
      iVar9 = iVar6;
      iVar10 = iVar1;
      iVar6 = iVar8;
    }
    local_b0 = (uint)bVar2;
    if ((bVar5 == true && bVar3 == false) && iVar7 < 50000) {
      clipSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      clipSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      clipSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      readPositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      readPositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      readPositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      genomePositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      genomePositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      genomePositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      bVar2 = BamTools::BamAlignment::GetSoftClips
                        (aln,&clipSizes,&readPositions,&genomePositions,false);
      if (!bVar2) {
        dn.refID = aln->RefID;
        dn.support = local_b0;
        dn.upStart = iVar10;
        dn.upEnd = iVar6;
        dn.downStart = iVar11;
        dn.downEnd = iVar9;
        std::vector<DiscNode,std::allocator<DiscNode>>::emplace_back<DiscNode&>
                  ((vector<DiscNode,std::allocator<DiscNode>> *)nodes,&dn);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&genomePositions.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&readPositions.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&clipSizes.super__Vector_base<int,_std::allocator<int>_>);
    }
  }
  return;
}

Assistant:

void addDisc(BamTools::BamAlignment &aln, const int &bpRegion, std::vector<DiscNode> &nodes)
{
	// both reads should be mapped
	if (!aln.IsMapped() || !aln.IsMateMapped())
		return;
	if (aln.IsProperPair())
		return;

	int upSt = aln.Position;
	int upEn = aln.GetEndPosition();
	bool upIsRev = aln.IsReverseStrand();
	int downSt = aln.MatePosition;
	int downEn = downSt + aln.Length;
	bool downIsRev = aln.IsMateReverseStrand();
	int insSz = aln.InsertSize;
	int support = 1;

	// current read is 3` and its mate at 5`
	if (aln.Position > aln.MatePosition)
	{
		std::swap(upSt, downSt);
		std::swap(upEn, downEn);
		std::swap(upIsRev, downIsRev);
		insSz *= -1;
		// do not add the same read twice
		support = 0;
	}

	if (insSz >= MAX_LARGE_DEL_LEN)
		return;

	// up should be forward and down should be reverse
	if (upIsRev || !downIsRev)
		return;

	std::vector<int> clipSizes, readPositions, genomePositions;
	bool isSC = aln.GetSoftClips(clipSizes, readPositions, genomePositions);
	// read should not have SC
	if (isSC)
		return;

	DiscNode dn(upSt, upEn, downSt, downEn, aln.RefID, support);
	nodes.emplace_back(dn);
}